

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  bool bVar1;
  iterator this_00;
  reference ppvVar2;
  LSTMBuilder *in_RDI;
  vector<float,_std::allocator<float>_> *v;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  *__range2;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<std::vector<float,_std::allocator<float>_>_**,_std::vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>_>
  local_18;
  LSTMBuilder *local_10;
  
  local_10 = in_RDI + 0x4a0;
  local_18._M_current =
       (vector<float,_std::allocator<float>_> **)
       std::
       vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
       ::begin((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                *)in_stack_ffffffffffffffc8);
  this_00 = std::
            vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ::end((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                   *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<float,_std::allocator<float>_>_**,_std::vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::vector<float,_std::allocator<float>_>_**,_std::vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<std::vector<float,_std::allocator<float>_>_**,_std::vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppvVar2;
    if (in_stack_ffffffffffffffc8 != (vector<float,_std::allocator<float>_> *)0x0) {
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this_00._M_current);
      operator_delete(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<float,_std::allocator<float>_>_**,_std::vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
             *)this_00._M_current);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::~vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
             this_00._M_current);
  LSTMBuilder::~LSTMBuilder(in_RDI);
  LSTMBuilder::~LSTMBuilder(in_RDI);
  LSTMBuilder::~LSTMBuilder(in_RDI);
  std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector
            ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_00._M_current);
  return;
}

Assistant:

AttentionalModel<Builder>::~AttentionalModel()
{
    for (auto v: aux_vecs)
        delete v;
}